

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O1

void __thiscall
embree::ISPCTriangleMesh::ISPCTriangleMesh
          (ISPCTriangleMesh *this,RTCDevice device,TutorialScene *scene_in,
          Ref<embree::SceneGraph::TriangleMeshNode> *in)

{
  uint uVar1;
  RTCGeometry pRVar2;
  Vec3fa **ppVVar3;
  long lVar4;
  Vec3fa *pVVar5;
  TriangleMeshNode *pTVar6;
  Vec2<float> *pVVar7;
  Triangle *pTVar8;
  ulong uVar9;
  pointer pvVar10;
  long lVar11;
  Ref<embree::SceneGraph::MaterialNode> local_38;
  
  (this->geom).type = TRIANGLE_MESH;
  (this->geom).geometry = (RTCGeometry)0x0;
  (this->geom).materialID = 0xffffffff;
  (this->geom).visited = false;
  this->positions = (Vec3fa **)0x0;
  this->normals = (Vec3fa **)0x0;
  pRVar2 = (RTCGeometry)rtcNewGeometry(device,0);
  (this->geom).geometry = pRVar2;
  ppVVar3 = (Vec3fa **)
            alignedUSMMalloc((long)(in->ptr->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(in->ptr->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 2,0x10,
                             DEVICE_READ_ONLY);
  this->positions = ppVVar3;
  pTVar6 = in->ptr;
  pvVar10 = (pTVar6->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(pTVar6->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10;
  if (lVar4 != 0) {
    lVar11 = 0;
    uVar9 = 0;
    do {
      pVVar5 = copyArrayToUSM<embree::Vec3fa>
                         ((avector<embree::Vec3fa> *)(&pvVar10->field_0x0 + lVar11));
      this->positions[uVar9] = pVVar5;
      uVar9 = uVar9 + 1;
      pTVar6 = in->ptr;
      pvVar10 = (pTVar6->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)(pTVar6->positions).
                    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10;
      lVar11 = lVar11 + 0x20;
    } while (uVar9 < (ulong)(lVar4 >> 5));
  }
  if ((pTVar6->normals).
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pTVar6->normals).
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppVVar3 = (Vec3fa **)alignedUSMMalloc(lVar4 >> 2,0x10,DEVICE_READ_ONLY);
    this->normals = ppVVar3;
    pTVar6 = in->ptr;
    if ((pTVar6->positions).
        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pTVar6->positions).
        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar4 = 0;
      uVar9 = 0;
      do {
        pVVar5 = copyArrayToUSM<embree::Vec3fa>
                           ((avector<embree::Vec3fa> *)
                            (&((pTVar6->normals).
                               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar4));
        this->normals[uVar9] = pVVar5;
        pTVar6 = in->ptr;
        uVar9 = uVar9 + 1;
        lVar4 = lVar4 + 0x20;
      } while (uVar9 < (ulong)((long)(pTVar6->positions).
                                     super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar6->positions).
                                     super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
  }
  pVVar7 = copyArrayToUSM<embree::Vec2<float>>(&in->ptr->texcoords);
  this->texcoords = pVVar7;
  this->startTime = (in->ptr->time_range).lower;
  this->endTime = (in->ptr->time_range).upper;
  this->numTimeSteps =
       (uint)((ulong)((long)(in->ptr->positions).
                            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(in->ptr->positions).
                           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  this->numVertices =
       (uint)((in->ptr->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->size_active;
  uVar1 = (*(in->ptr->super_Node).super_RefCount._vptr_RefCount[0xe])();
  this->numTriangles = uVar1;
  local_38.ptr = (in->ptr->material).ptr;
  if (local_38.ptr != (MaterialNode *)0x0) {
    (*((local_38.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  uVar1 = TutorialScene::materialID(scene_in,&local_38);
  (this->geom).materialID = uVar1;
  if (local_38.ptr != (MaterialNode *)0x0) {
    (*((local_38.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pTVar8 = copyArrayToUSM<embree::SceneGraph::TriangleMeshNode::Triangle>(&in->ptr->triangles);
  this->triangles = (ISPCTriangle *)pTVar8;
  return;
}

Assistant:

ISPCTriangleMesh::ISPCTriangleMesh (RTCDevice device, TutorialScene* scene_in, Ref<SceneGraph::TriangleMeshNode> in) 
    : geom(TRIANGLE_MESH), positions(nullptr), normals(nullptr)
  {
    geom.geometry = rtcNewGeometry (device, RTC_GEOMETRY_TYPE_TRIANGLE);
   
    positions = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*in->numTimeSteps());
    for (size_t i=0; i<in->numTimeSteps(); i++)
      positions[i] = copyArrayToUSM(in->positions[i]);
    
    if (in->normals.size()) {
      normals = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*in->numTimeSteps());
      for (size_t i=0; i<in->numTimeSteps(); i++)
        normals[i] = copyArrayToUSM(in->normals[i]);
    }
    
    texcoords = copyArrayToUSM(in->texcoords);

    startTime = in->time_range.lower;
    endTime   = in->time_range.upper;
    numTimeSteps = (unsigned) in->numTimeSteps();
    numVertices = (unsigned) in->numVertices();
    numTriangles = (unsigned) in->numPrimitives();
    geom.materialID = scene_in->materialID(in->material);
    triangles = (ISPCTriangle*) copyArrayToUSM(in->triangles);
  }